

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

char * zt_cstr_dup(char *s,ssize_t i,ssize_t j,ssize_t n)

{
  size_t sVar1;
  size_t sVar2;
  long in_RCX;
  long lVar3;
  char *in_RDI;
  ssize_t t;
  size_t len;
  char *p;
  char *new;
  ssize_t k;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  char *local_40;
  size_t local_30;
  long local_28;
  size_t local_20;
  size_t local_18;
  char *local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    sVar1 = strlen(in_RDI);
    if (sVar1 == 0) {
      local_18 = 0;
      local_20 = 0;
    }
    else {
      local_18 = IDX(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      sVar2 = IDX(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      local_20 = sVar2;
      if ((long)sVar2 < (long)local_18) {
        in_stack_ffffffffffffffb0 = local_18;
        local_20 = local_18;
        local_18 = sVar2;
      }
    }
    IDXLEN(local_18,local_20);
    local_8 = (char *)zt_malloc_p(in_stack_ffffffffffffffb0);
    sVar2 = IDXLEN(local_18,local_20);
    local_40 = local_8;
    local_28 = in_RCX;
    if (sVar2 != 0) {
      while (lVar3 = local_28 + -1, 0 < local_28) {
        for (local_30 = local_18; local_28 = lVar3, (long)local_30 <= (long)local_20;
            local_30 = local_30 + 1) {
          *local_40 = in_RDI[local_30];
          local_40 = local_40 + 1;
        }
      }
    }
    *local_40 = '\0';
  }
  return local_8;
}

Assistant:

char *
zt_cstr_dup(const char *s, ssize_t i, ssize_t j, ssize_t n) {
    ssize_t   k;
    char    * new;
    char    * p;

    zt_assert(n >= 0);

    if (!s) {
        return NULL;
    }

    CONVERT(s, i, j);

    p = new = zt_malloc(char, (n * IDXLEN(i, j)) + 1);

    if (IDXLEN(i, j) > 0) {
        while (n-- > 0) {
            for (k = i; k <= j; k++) {
                *p++ = s[k];
            }
        }
    }

    *p = '\0';

    return new;
}